

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O0

void __thiscall LsuContent::LsuContent(LsuContent *this,istream *is)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  char *in_RSI;
  OspfContent *in_RDI;
  undefined1 auVar4 [16];
  shared_ptr<NetworkLsa> lsa_1;
  shared_ptr<RouterLsa> lsa;
  uint8_t lsa_type;
  pos_type pos;
  LsaHeader temp_header;
  uint32_t num;
  value_type *in_stack_ffffffffffffff18;
  vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_> *in_stack_ffffffffffffff20;
  basic_istream<char,_std::char_traits<char>_> *__args;
  vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_> local_a8 [2];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char local_49;
  undefined1 local_48 [16];
  undefined1 local_34 [3];
  char local_31;
  ushort local_22;
  int local_20;
  char *local_10;
  
  local_10 = in_RSI;
  OspfContent::OspfContent(in_RDI);
  in_RDI->_vptr_OspfContent = (_func_int **)&PTR__LsuContent_0017d4c8;
  __args = (basic_istream<char,_std::char_traits<char>_> *)(in_RDI + 2);
  std::vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>::vector
            ((vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_> *)0x155a9a);
  std::istream::read(local_10,(long)(in_RDI + 1));
  uVar3 = ntohl(*(uint32_t *)&in_RDI[1]._vptr_OspfContent);
  *(uint32_t *)&in_RDI[1]._vptr_OspfContent = uVar3;
  for (local_20 = *(int *)&in_RDI[1]._vptr_OspfContent; local_20 != 0; local_20 = local_20 + -1) {
    auVar4 = std::istream::tellg();
    local_48 = auVar4;
    std::istream::read(local_10,(long)local_34);
    uVar2 = local_48._8_8_;
    uVar1 = local_48._0_8_;
    local_49 = local_31;
    local_68 = local_48._0_4_;
    uStack_64 = local_48._4_4_;
    uStack_60 = local_48._8_4_;
    uStack_5c = local_48._12_4_;
    std::istream::seekg(local_10,uVar1,uVar2);
    if (local_49 == '\x01') {
      std::make_shared<RouterLsa,std::istream&>(__args);
      std::shared_ptr<Lsa>::shared_ptr<RouterLsa,void>
                ((shared_ptr<Lsa> *)in_stack_ffffffffffffff20,
                 (shared_ptr<RouterLsa> *)in_stack_ffffffffffffff18);
      std::vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>::push_back
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::shared_ptr<Lsa>::~shared_ptr((shared_ptr<Lsa> *)0x155bd4);
      std::shared_ptr<RouterLsa>::~shared_ptr((shared_ptr<RouterLsa> *)0x155bde);
    }
    else if (local_49 == '\x02') {
      std::make_shared<NetworkLsa,std::istream&>(__args);
      in_stack_ffffffffffffff18 = (value_type *)(in_RDI + 2);
      in_stack_ffffffffffffff20 = local_a8;
      std::shared_ptr<Lsa>::shared_ptr<NetworkLsa,void>
                ((shared_ptr<Lsa> *)in_stack_ffffffffffffff20,
                 (shared_ptr<NetworkLsa> *)in_stack_ffffffffffffff18);
      std::vector<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>::push_back
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::shared_ptr<Lsa>::~shared_ptr((shared_ptr<Lsa> *)0x155c89);
      std::shared_ptr<NetworkLsa>::~shared_ptr((shared_ptr<NetworkLsa> *)0x155c93);
    }
    else {
      std::istream::seekg((long)local_10,(uint)local_22);
    }
  }
  return;
}

Assistant:

LsuContent::LsuContent(std::istream& is)
{
    is.read((char*)&lsa_num, 4);
    lsa_num      = ntohl(lsa_num);
    uint32_t num = lsa_num;
    while (num != 0)
    {
        //取得lsa的type并将istream恢复位置
        LsaHeader temp_header;
        auto      pos = is.tellg();
        is.read((char*)&temp_header, sizeof(LsaHeader));
        uint8_t lsa_type = temp_header.lsa_type;
        is.seekg(pos);

        //根据type创建不同的lsa
        if (lsa_type == 1)  // router-lsa
        {
            auto lsa = std::make_shared<RouterLsa>(is);
            lsas.push_back(lsa);
        }
        else if (lsa_type == 2)  // network-lsa
        {
            auto lsa = std::make_shared<NetworkLsa>(is);
            lsas.push_back(lsa);
        }
        else  //其他lsa跳过 TODO
        {
            // std::cout << "ignore other lsa -- type: " << (uint16_t)lsa_type
            // << '\n';
            is.seekg(temp_header.tlen, std::ios::cur);
        }

        --num;
    }
}